

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

void OpenSld(void)

{
  pointer pbVar1;
  char cVar2;
  pointer pbVar3;
  bool bVar4;
  string local_48;
  
  if (FP_SourceLevelDebugging == (FILE *)0x0) {
    cVar2 = std::filesystem::__cxx11::path::has_filename();
    if ((cVar2 == '\0') && (Options::IsDefaultSldName == '\x01')) {
      ConstructDefaultFilename((path *)Options::SourceLevelDebugFName_abi_cxx11_,"sld.txt",false);
    }
    cVar2 = std::filesystem::__cxx11::path::has_filename();
    if (cVar2 != '\0') {
      FP_SourceLevelDebugging = SJ_fopen((path *)Options::SourceLevelDebugFName_abi_cxx11_,"w");
      if (FP_SourceLevelDebugging == (FILE *)0x0) {
        std::filesystem::__cxx11::path::string
                  (&local_48,(path *)Options::SourceLevelDebugFName_abi_cxx11_);
        Error("opening file for write",local_48._M_dataplus._M_p,FATAL);
        std::__cxx11::string::~string((string *)&local_48);
      }
      fputs("|SLD.data.version|1\n",(FILE *)FP_SourceLevelDebugging);
      if (sldCommentKeywords_abi_cxx11_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          sldCommentKeywords_abi_cxx11_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        fputs("||K|KEYWORDS|",(FILE *)FP_SourceLevelDebugging);
        pbVar1 = sldCommentKeywords_abi_cxx11_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar4 = false;
        for (pbVar3 = sldCommentKeywords_abi_cxx11_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1;
            pbVar3 = pbVar3 + 1) {
          std::__cxx11::string::string((string *)&local_48,(string *)pbVar3);
          if (bVar4) {
            fputs(",",(FILE *)FP_SourceLevelDebugging);
          }
          fputs(local_48._M_dataplus._M_p,(FILE *)FP_SourceLevelDebugging);
          std::__cxx11::string::~string((string *)&local_48);
          bVar4 = true;
        }
        fputs(anon_var_dwarf_e1393 + 5,(FILE *)FP_SourceLevelDebugging);
      }
    }
  }
  return;
}

Assistant:

void OpenSld() {
	// check if source-level-debug file is already opened
	if (nullptr != FP_SourceLevelDebugging) return;
	// build default filename if not explicitly provided, and default was requested
	OpenSld_buildDefaultNameIfNeeded();
	// try to open it if not opened yet
	OpenSldImp(Options::SourceLevelDebugFName);
}